

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O1

void __thiscall Material::removeFloatUniform(Material *this,string *uniformName)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>_>
               ::find(&(this->floatUniforms)._M_t,uniformName);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->floatUniforms)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>_>
    ::_M_erase_aux(&(this->floatUniforms)._M_t,(const_iterator)__position._M_node);
    return;
  }
  return;
}

Assistant:

void Material::removeFloatUniform(std::string uniformName)
{
	std::map<std::string, float*>::iterator it;
	it = floatUniforms.find(uniformName);
	if (it != floatUniforms.end())
	{
		floatUniforms.erase(it);
	}
}